

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int DataTypeFormatString(char *buf,int buf_size,ImGuiDataType data_type,void *data_ptr,char *format)

{
  int iVar1;
  double dVar2;
  
  if ((uint)data_type < 2) {
    iVar1 = ImFormatString(buf,buf_size,format,(ulong)*data_ptr);
    return iVar1;
  }
  if ((data_type & 0xfffffffeU) == 2) {
    iVar1 = ImFormatString(buf,buf_size,format,*data_ptr);
    return iVar1;
  }
  if (data_type == 5) {
    dVar2 = *data_ptr;
  }
  else {
    if (data_type != 4) {
      return 0;
    }
    dVar2 = (double)*data_ptr;
  }
  iVar1 = ImFormatString(buf,buf_size,format,dVar2);
  return iVar1;
}

Assistant:

static inline int DataTypeFormatString(char* buf, int buf_size, ImGuiDataType data_type, const void* data_ptr, const char* format)
{
    if (data_type == ImGuiDataType_S32 || data_type == ImGuiDataType_U32)   // Signedness doesn't matter when pushing the argument
        return ImFormatString(buf, buf_size, format, *(const ImU32*)data_ptr);
    if (data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)   // Signedness doesn't matter when pushing the argument
        return ImFormatString(buf, buf_size, format, *(const ImU64*)data_ptr);
    if (data_type == ImGuiDataType_Float)
        return ImFormatString(buf, buf_size, format, *(const float*)data_ptr);
    if (data_type == ImGuiDataType_Double)
        return ImFormatString(buf, buf_size, format, *(const double*)data_ptr);
    IM_ASSERT(0);
    return 0;
}